

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

UniValue * __thiscall
CRPCConvertTable::ArgToUniValue
          (CRPCConvertTable *this,string_view arg_value,string *method,int param_idx)

{
  long lVar1;
  string_view raw;
  size_type sVar2;
  char *in_RSI;
  UniValue *in_RDI;
  UniValue *in_R8;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *in_stack_ffffffffffffff48;
  key_type *in_stack_ffffffffffffff50;
  UniValue *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<int_&,_true>((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     *)in_RDI,&in_stack_ffffffffffffff50->first,(int *)in_stack_ffffffffffffff48);
  sVar2 = std::
          set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::count((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)this_00,in_stack_ffffffffffffff50);
  if (sVar2 == 0) {
    UniValue::
    UniValue<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (in_R8,in_stack_ffffffffffffff88);
  }
  else {
    raw._M_str = in_RSI;
    raw._M_len = (size_t)in_R8;
    Parse(raw);
  }
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ArgToUniValue(std::string_view arg_value, const std::string& method, int param_idx)
    {
        return members.count({method, param_idx}) > 0 ? Parse(arg_value) : arg_value;
    }